

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

bool __thiscall
FlatSigningProvider::GetPubKey(FlatSigningProvider *this,CKeyID *keyid,CPubKey *pubkey)

{
  long lVar1;
  const_iterator cVar2;
  _Rb_tree_header *p_Var3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          ::find(&(this->pubkeys)._M_t,keyid);
  p_Var3 = &(this->pubkeys)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    memcpy(pubkey,(void *)((long)&cVar2._M_node[1]._M_left + 4),0x41);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Rb_tree_header *)cVar2._M_node != p_Var3;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetPubKey(const CKeyID& keyid, CPubKey& pubkey) const { return LookupHelper(pubkeys, keyid, pubkey); }